

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O0

QString * __thiscall QSqlTableModel::orderByClause(QSqlTableModel *this)

{
  bool bVar1;
  QSqlTableModelPrivate *pQVar2;
  QSqlDriver *pQVar3;
  QString *in_RSI;
  QSqlField *in_RDI;
  long in_FS_OFFSET;
  QSqlTableModelPrivate *d;
  QString field;
  QSqlField f;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *in_stack_fffffffffffffeb8;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *in_stack_fffffffffffffec0;
  QSqlField *this_00;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined1 local_108 [24];
  undefined1 local_f0 [24];
  undefined1 local_d8 [30];
  undefined2 local_ba;
  undefined1 local_b8 [24];
  QString local_a0 [4];
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = d_func((QSqlTableModel *)0x16f45d);
  memset(local_30,0xaa,0x28);
  QSqlRecord::field((QSqlRecord *)this_00,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
  bVar1 = QSqlField::isValid((QSqlField *)in_stack_fffffffffffffec0);
  if (bVar1) {
    local_a0[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_a0[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_a0[0].d.size = -0x5555555555555556;
    pQVar3 = QSqlDatabase::driver(&pQVar2->db);
    (**(code **)(*(long *)pQVar3 + 0xa0))(local_b8,pQVar3,&pQVar2->tableName,1);
    local_ba = 0x2e;
    ::operator+((QString *)this_00,(char16_t *)in_stack_fffffffffffffec0);
    in_stack_fffffffffffffec0 =
         (QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)
         QSqlDatabase::driver(&pQVar2->db);
    QSqlField::name(this_00);
    (**(code **)&(in_stack_fffffffffffffec0->a).a.d.d[10].super_QArrayData)
              (local_d8,in_stack_fffffffffffffec0,local_f0,0);
    ::operator+((QStringBuilder<QString,_char16_t> *)this_00,(QString *)in_stack_fffffffffffffec0);
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffeb8);
    QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
              (in_stack_fffffffffffffec0);
    QString::~QString((QString *)0x16f5d7);
    QString::~QString((QString *)0x16f5e1);
    QStringBuilder<QString,_char16_t>::~QStringBuilder
              ((QStringBuilder<QString,_char16_t> *)0x16f5ee);
    QString::~QString((QString *)0x16f5fb);
    if (pQVar2->sortOrder == AscendingOrder) {
      QSqlQueryModelSql::asc(in_RSI);
    }
    else {
      QSqlQueryModelSql::desc(in_RSI);
    }
    QString::operator=(local_a0,(QString *)local_108);
    QString::~QString((QString *)0x16f64b);
    QSqlQueryModelSql::orderBy
              ((QString *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    QString::~QString((QString *)0x16f672);
  }
  else {
    QString::QString((QString *)0x16f4b8);
  }
  QSqlField::~QSqlField((QSqlField *)in_stack_fffffffffffffec0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlTableModel::orderByClause() const
{
    Q_D(const QSqlTableModel);
    QSqlField f = d->rec.field(d->sortColumn);
    if (!f.isValid())
        return QString();

    //we can safely escape the field because it would have been obtained from the database
    //and have the correct case
    QString field = d->db.driver()->escapeIdentifier(d->tableName, QSqlDriver::TableName)
            + u'.'
            + d->db.driver()->escapeIdentifier(f.name(), QSqlDriver::FieldName);
    field = d->sortOrder == Qt::AscendingOrder ? SqlTm::asc(field) : SqlTm::desc(field);
    return SqlTm::orderBy(field);
}